

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict st_assert(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  int iVar2;
  char *pcVar3;
  node_t_conflict op1_00;
  undefined1 local_48 [8];
  pos_t pos;
  node_t_conflict r;
  node_t_conflict op1;
  parse_ctx_t parse_ctx;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->parse_ctx;
  iVar2 = match(c2m_ctx,0x117,(pos_t *)local_48,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar2 == 0) {
    if (ppVar1->record_level == 0) {
      pcVar3 = get_token_name(c2m_ctx,0x117);
      syntax_error(c2m_ctx,pcVar3);
    }
    c2m_ctx_local = (c2m_ctx_t)&err_struct;
  }
  else {
    iVar2 = match(c2m_ctx,0x28,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if (iVar2 == 0) {
      if (ppVar1->record_level == 0) {
        pcVar3 = get_token_name(c2m_ctx,0x28);
        syntax_error(c2m_ctx,pcVar3);
      }
      c2m_ctx_local = (c2m_ctx_t)&err_struct;
    }
    else {
      op1_00 = cond_expr(c2m_ctx,no_err_p);
      if (op1_00 == &err_struct) {
        c2m_ctx_local = (c2m_ctx_t)&err_struct;
      }
      else {
        pos._8_8_ = op1_00;
        iVar2 = match(c2m_ctx,0x2c,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
        if (iVar2 == 0) {
          if (ppVar1->record_level == 0) {
            pcVar3 = get_token_name(c2m_ctx,0x2c);
            syntax_error(c2m_ctx,pcVar3);
          }
          c2m_ctx_local = (c2m_ctx_t)&err_struct;
        }
        else {
          iVar2 = match(c2m_ctx,0x102,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)&pos.lno);
          if (iVar2 == 0) {
            if (ppVar1->record_level == 0) {
              pcVar3 = get_token_name(c2m_ctx,0x102);
              syntax_error(c2m_ctx,pcVar3);
            }
            c2m_ctx_local = (c2m_ctx_t)&err_struct;
          }
          else {
            iVar2 = match(c2m_ctx,0x29,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
            if (iVar2 == 0) {
              if (ppVar1->record_level == 0) {
                pcVar3 = get_token_name(c2m_ctx,0x29);
                syntax_error(c2m_ctx,pcVar3);
              }
              c2m_ctx_local = (c2m_ctx_t)&err_struct;
            }
            else {
              iVar2 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
              if (iVar2 == 0) {
                if (ppVar1->record_level == 0) {
                  pcVar3 = get_token_name(c2m_ctx,0x3b);
                  syntax_error(c2m_ctx,pcVar3);
                }
                c2m_ctx_local = (c2m_ctx_t)&err_struct;
              }
              else {
                c2m_ctx_local =
                     (c2m_ctx_t)
                     new_pos_node2(c2m_ctx,N_ST_ASSERT,_local_48,op1_00,(node_t_conflict)pos._8_8_);
              }
            }
          }
        }
      }
    }
  }
  return (node_t_conflict)c2m_ctx_local;
}

Assistant:

D (st_assert) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t op1, r;
  pos_t pos;

  PTP (T_STATIC_ASSERT, pos);
  PT ('(');
  P (const_expr);
  op1 = r;
  PT (',');
  PTN (T_STR);
  PT (')');
  PT (';');
  r = new_pos_node2 (c2m_ctx, N_ST_ASSERT, pos, op1, r);
  return r;
}